

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

void bio_hdrarg_free(char **argname,char **argval)

{
  long lVar1;
  
  if (argname != (char **)0x0) {
    for (lVar1 = 0; *(void **)((long)argname + lVar1) != (void *)0x0; lVar1 = lVar1 + 8) {
      ckd_free(*(void **)((long)argname + lVar1));
      ckd_free(*(void **)((long)argval + lVar1));
    }
    ckd_free(argname);
    ckd_free(argval);
    return;
  }
  return;
}

Assistant:

void
bio_hdrarg_free(char **argname, char **argval)
{
    int32 i;

    if (argname == NULL)
        return;
    for (i = 0; argname[i]; i++) {
        ckd_free(argname[i]);
        ckd_free(argval[i]);
    }
    ckd_free(argname);
    ckd_free(argval);
}